

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

GdlExpression * __thiscall
GdlNumericExpression::ConvertFeatureSettingValue
          (GdlNumericExpression *this,GdlFeatureDefn *pfeat,bool *fErr)

{
  allocator local_31;
  string local_30;
  
  if (pfeat->m_fStdLang == true) {
    std::__cxx11::string::string
              ((string *)&local_30,"Numeric value where language ID string expected",&local_31);
    GrcErrorList::AddWarning(&g_errorList,0x9d6,(GdlObject *)&this->field_0x8,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (GdlExpression *)this;
}

Assistant:

GdlExpression * GdlNumericExpression::ConvertFeatureSettingValue(GdlFeatureDefn * pfeat, bool & fErr)
{
	if (pfeat->IsLanguageFeature())
		g_errorList.AddWarning(2518, this,
			"Numeric value where language ID string expected");

	return this;
}